

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask10_24(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  undefined1 auVar6 [16];
  long unaff_RBP;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  vpmovsxbd_avx(ZEXT416(0x3024180c));
  auVar10 = vpmovsxbd_avx(ZEXT416(0x2020004));
  auVar6 = vpmovsxbd_avx(ZEXT416(0x606020a));
  vpmovsxbd_avx(ZEXT416(0x2c201408));
  auVar7 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(in[4] << 8)));
  auVar8 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + unaff_RBP));
  auVar8 = vpsllvd_avx2(auVar8,_DAT_001aa5a0);
  auVar9 = vpermi2d_avx512vl(auVar10,auVar7,ZEXT416(in[1]));
  auVar10 = vpinsrd_avx(auVar9,in[7],2);
  auVar9 = vpsrlvd_avx2(auVar9,auVar6);
  auVar10 = vpsllvd_avx2(auVar10,auVar6);
  auVar6 = vpblendd_avx2(auVar10,auVar9,10);
  auVar10 = vpinsrd_avx(ZEXT416(*in),in[4] << 8,1);
  auVar10 = vpinsrd_avx(auVar10,auVar7._4_4_ >> 4,2);
  uVar1 = in[0xe];
  auVar9 = vpsllvd_avx2(auVar7,_DAT_001aa150);
  auVar10 = vpinsrd_avx(auVar10,in[10] << 4,3);
  uVar2 = in[0xd];
  auVar10 = vpor_avx(auVar6,auVar10);
  uVar3 = in[0xf];
  auVar10 = vpternlogd_avx512vl(auVar9,auVar8,auVar10,0xfe);
  *(undefined1 (*) [16])out = auVar10;
  uVar4 = in[0x13];
  uVar5 = in[0x11];
  out[4] = uVar3 << 0x16 | uVar1 << 0xc | uVar2 << 2 | auVar7._12_4_ >> 8;
  uVar1 = in[0x15];
  uVar2 = in[0x14];
  out[5] = uVar4 << 0x1e | in[0x12] << 0x14 | uVar5 << 10 | in[0x10];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(in + 0x16);
  auVar6 = vpsllvd_avx2(auVar10,_DAT_001aa020);
  auVar10 = vpinsrd_avx(ZEXT416(uVar1 << 0x12 | uVar2 << 8 | uVar4 >> 2),
                        (uint)(*(ulong *)(in + 0x16) >> 4) & 0xfffffff,1);
  auVar10 = vpor_avx(auVar6,auVar10);
  *(long *)(out + 6) = auVar10._0_8_;
  return out + 8;
}

Assistant:

uint32_t *__fastpackwithoutmask10_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (10 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (10 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (10 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (10 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (10 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (10 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;

  return out + 1;
}